

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

void __thiscall Iex_3_2::BaseExc::BaseExc(BaseExc *this,string *s)

{
  *(undefined ***)this = &PTR__EdircorruptedExc_00173618;
  std::__cxx11::string::string((string *)&this->_message,(string *)s);
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    (this->_stackTrace)._M_string_length = 0;
    (this->_stackTrace).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(&this->_stackTrace);
  }
  return;
}

Assistant:

BaseExc::BaseExc (const std::string& s)
    : _message (s)
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{
    // empty
}